

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O0

void __thiscall Camera::Camera(Camera *this,vec3 position,vec3 up,GLfloat yaw,GLfloat pitch)

{
  GLfloat pitch_local;
  GLfloat yaw_local;
  Camera *this_local;
  vec3 up_local;
  vec3 position_local;
  
  memset(this,0,0xc);
  glm::vec<3,_float,_(glm::qualifier)0>::vec(&this->Front,0.0,0.0,-1.0);
  memset(&this->Up,0,0xc);
  memset(&this->Right,0,0xc);
  memset(&this->WorldUp,0,0xc);
  this->MovementSpeed = 3.0;
  this->MouseSensitivity = 0.25;
  this->Zoom = 45.0;
  (this->Position).field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)position._0_8_;
  (this->Position).field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
       (int)((ulong)position._0_8_ >> 0x20);
  (this->Position).field_2 = position.field_2;
  (this->WorldUp).field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)up._0_8_;
  (this->WorldUp).field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
       (int)((ulong)up._0_8_ >> 0x20);
  (this->WorldUp).field_2 = up.field_2;
  this->Yaw = yaw;
  this->Pitch = pitch;
  updateCameraVectors(this);
  return;
}

Assistant:

explicit Camera(glm::vec3 position = glm::vec3(0.0f, 0.0f, 0.0f), glm::vec3 up = glm::vec3(0.0f, 1.0f, 0.0f),
                    GLfloat yaw = YAW, GLfloat pitch = PITCH)
            : Front(glm::vec3(0.0f, 0.0f, -1.0f)), MovementSpeed(SPEED), MouseSensitivity(SENSITIVITY), Zoom(ZOOM) {
        this->Position = position;
        this->WorldUp = up;
        this->Yaw = yaw;
        this->Pitch = pitch;
        this->updateCameraVectors();
    }